

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::BadVulkanAllocExceptionTest_NoHostMemory_Test::TestBody
          (BadVulkanAllocExceptionTest_NoHostMemory_Test *this)

{
  undefined8 uVar1;
  AssertionResult gtest_ar;
  bad_vulkan_alloc *e;
  char *in_stack_00000040;
  int in_stack_0000004c;
  
  uVar1 = __cxa_allocate_exception(0x1b0);
  bad_vulkan_alloc::bad_vulkan_alloc((bad_vulkan_alloc *)this,in_stack_0000004c,in_stack_00000040);
  __cxa_throw(uVar1,&bad_vulkan_alloc::typeinfo,bad_vulkan_alloc::~bad_vulkan_alloc);
}

Assistant:

TEST(BadVulkanAllocExceptionTest, NoHostMemory) {
    try {
        throw bad_vulkan_alloc(OUT_OF_HOST_MEMORY, "no host memory test");
    } catch (bad_vulkan_alloc& e) {
        EXPECT_EQ(strcmp(e.what(), "Out of host memory for no host memory test."), 0);
    }
}